

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall
midi_container::scan_for_loops
          (midi_container *this,bool p_xmi_loops,bool p_marker_loops,bool p_rpgmaker_loops,
          bool p_touhou_loops)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  uint uVar1;
  pointer puVar2;
  pointer pmVar3;
  unsigned_long uVar4;
  int iVar5;
  size_type __new_size;
  ulong uVar6;
  pointer puVar7;
  size_type sVar8;
  long lVar9;
  char cVar10;
  unsigned_long j;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong *puVar14;
  unsigned_long uVar15;
  char *pcVar16;
  pointer *ppmVar17;
  long lVar18;
  midi_event *this_02;
  ulong uVar19;
  pointer pmVar20;
  bool bVar21;
  bool bVar22;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_form == 2) {
    __new_size = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                       _M_impl.super__Vector_impl_data._M_start) / 0x18;
  }
  else {
    __new_size = 1;
  }
  this_00 = &this->m_timestamp_loop_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,__new_size);
  this_01 = &this->m_timestamp_loop_end;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,__new_size);
  puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar8 = 0; __new_size != sVar8; sVar8 = sVar8 + 1) {
    puVar7[sVar8] = 0xffffffffffffffff;
    puVar2[sVar8] = 0xffffffffffffffff;
  }
  uVar1 = this->m_form;
  if (p_touhou_loops && uVar1 == 0) {
    pmVar20 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar3 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar9 = 0;
    bVar22 = false;
    while (!bVar22) {
      if (lVar9 == ((long)pmVar3 - (long)pmVar20) / 0x18) goto LAB_00106160;
      puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pmVar20[lVar9].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      lVar18 = (long)*(pointer *)
                      ((long)&pmVar20[lVar9].m_events.
                              super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                      8) - lVar13 >> 6;
      pcVar16 = (char *)(lVar13 + 0x19);
      while (bVar21 = lVar18 != 0, lVar18 = lVar18 + -1, bVar21) {
        if (*(int *)(pcVar16 + -0x11) == 3) {
          cVar10 = pcVar16[-1];
          if (cVar10 == '\x02') {
            if (*pcVar16 == '\0') {
              *puVar7 = *(unsigned_long *)(pcVar16 + -0x19);
              cVar10 = pcVar16[-1];
              goto LAB_00106128;
            }
LAB_00106140:
            bVar22 = true;
            break;
          }
LAB_00106128:
          if (cVar10 == '\x04') {
            if (*pcVar16 != '\0') goto LAB_00106140;
            *puVar2 = *(unsigned_long *)(pcVar16 + -0x19);
          }
        }
        pcVar16 = pcVar16 + 0x40;
      }
      lVar9 = lVar9 + 1;
    }
    *(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
     super__Vector_impl_data._M_start = 0xffffffffffffffff;
    *(this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
     super__Vector_impl_data._M_start = 0xffffffffffffffff;
  }
LAB_00106160:
  if (p_rpgmaker_loops) {
    pmVar20 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar3 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar9 = 0; lVar9 != ((long)pmVar3 - (long)pmVar20) / 0x18; lVar9 = lVar9 + 1) {
      lVar13 = 0;
      if (uVar1 == 2) {
        lVar13 = lVar9;
      }
      puVar14 = *(ulong **)
                 &pmVar20[lVar9].m_events.
                  super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      lVar18 = (long)*(pointer *)
                      ((long)&pmVar20[lVar9].m_events.
                              super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                      8) - (long)puVar14 >> 6;
      puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      while (bVar22 = lVar18 != 0, lVar18 = lVar18 + -1, bVar22) {
        if (((int)puVar14[1] == 3) && (((byte)puVar14[3] & 0xfe) == 0x6e)) {
          if ((byte)puVar14[3] == 0x6e) {
            (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar13] = 0xffffffffffffffff;
            (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar13] = 0xffffffffffffffff;
            goto LAB_0010620e;
          }
          uVar6 = puVar7[lVar13];
          if ((uVar6 == 0xffffffffffffffff) || (*puVar14 < uVar6)) {
            puVar7[lVar13] = *puVar14;
          }
        }
        puVar14 = puVar14 + 8;
      }
    }
  }
LAB_0010620e:
  if (p_xmi_loops) {
    pmVar20 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
              super__Vector_impl_data._M_start;
    pmVar3 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar9 = 0; lVar9 != ((long)pmVar3 - (long)pmVar20) / 0x18; lVar9 = lVar9 + 1) {
      lVar13 = 0;
      if (uVar1 == 2) {
        lVar13 = lVar9;
      }
      puVar14 = *(ulong **)
                 &pmVar20[lVar9].m_events.
                  super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl;
      lVar18 = (long)*(pointer *)
                      ((long)&pmVar20[lVar9].m_events.
                              super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl +
                      8) - (long)puVar14 >> 6;
      puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      while (bVar22 = lVar18 != 0, lVar18 = lVar18 + -1, bVar22) {
        if (((int)puVar14[1] == 3) && (((byte)puVar14[3] & 0xfc) == 0x74)) {
          if ((byte)((byte)puVar14[3] | 2) == 0x76) {
            uVar6 = puVar7[lVar13];
            if ((uVar6 == 0xffffffffffffffff) || (*puVar14 < uVar6)) {
              puVar7[lVar13] = *puVar14;
            }
          }
          else {
            uVar6 = puVar2[lVar13];
            if ((uVar6 == 0xffffffffffffffff) || (uVar6 < *puVar14)) {
              puVar2[lVar13] = *puVar14;
            }
          }
        }
        puVar14 = puVar14 + 8;
      }
    }
  }
  if (p_marker_loops) {
    uVar12 = 0;
    while( true ) {
      pmVar20 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl
                .super__Vector_impl_data._M_start;
      uVar6 = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pmVar20) / 0x18;
      if (uVar6 <= uVar12) break;
      uVar6 = 0;
      if (this->m_form == 2) {
        uVar6 = uVar12;
      }
      lVar9 = 0;
      for (uVar11 = 0;
          lVar13 = *(long *)&pmVar20[uVar12].m_events.
                             super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl,
          uVar11 < (ulong)((long)*(pointer *)
                                  ((long)&pmVar20[uVar12].m_events.
                                          super__Vector_base<midi_event,_std::allocator<midi_event>_>
                                          ._M_impl + 8) - lVar13 >> 6); uVar11 = uVar11 + 1) {
        if ((((*(int *)(lVar13 + 8 + lVar9) == 7) &&
             (uVar19 = (*(long *)(lVar13 + 0x10 + lVar9) + *(long *)(lVar13 + 0x30 + lVar9)) -
                       *(long *)(lVar13 + 0x28 + lVar9), 8 < uVar19)) &&
            (*(char *)(lVar13 + 0x18 + lVar9) == -1)) &&
           (*(char *)(lVar13 + 0x19 + lVar9) == '\x06')) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&data,uVar19 - 2);
          this_02 = (midi_event *)(lVar13 + lVar9);
          midi_event::copy_data
                    (this_02,data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,2,uVar19 - 2);
          if (uVar19 == 9) {
            iVar5 = strncasecmp((char *)data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"loopEnd",7);
            if (iVar5 == 0) {
              puVar7 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              uVar19 = this_02->m_timestamp;
              if ((puVar7[uVar6] == 0xffffffffffffffff) || (puVar7[uVar6] < uVar19))
              goto LAB_0010641b;
            }
          }
          else if ((uVar19 == 0xb) &&
                  (iVar5 = strncasecmp((char *)data.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start,"loopStart"
                                       ,9), iVar5 == 0)) {
            puVar7 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar19 = this_02->m_timestamp;
            if ((puVar7[uVar6] == 0xffffffffffffffff) || (uVar19 < puVar7[uVar6])) {
LAB_0010641b:
              puVar7[uVar6] = uVar19;
            }
          }
        }
        lVar9 = lVar9 + 0x40;
      }
      uVar12 = uVar12 + 1;
    }
  }
  else {
    pmVar20 = (this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pmVar20) / 0x18;
  }
  uVar1 = this->m_form;
  puVar7 = (this->m_timestamp_loop_start).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_timestamp_loop_end).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar8 = 0; sVar8 != __new_size; sVar8 = sVar8 + 1) {
    if (uVar1 == 2) {
      uVar15 = (*(pointer *)
                 ((long)&pmVar20[sVar8].m_events.
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8))
               [-1].m_timestamp;
    }
    else {
      uVar15 = 0;
      ppmVar17 = (pointer *)
                 ((long)&(pmVar20->m_events).
                         super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl + 8);
      uVar12 = uVar6;
      while (bVar22 = uVar12 != 0, uVar12 = uVar12 - 1, bVar22) {
        if (uVar15 < (*ppmVar17)[-1].m_timestamp) {
          uVar15 = (*ppmVar17)[-1].m_timestamp;
        }
        ppmVar17 = ppmVar17 + 3;
      }
    }
    uVar4 = puVar7[sVar8];
    if ((uVar4 != 0xffffffffffffffff) && ((uVar4 == puVar2[sVar8] || (uVar4 == uVar15)))) {
      puVar7[sVar8] = 0xffffffffffffffff;
      puVar2[sVar8] = 0xffffffffffffffff;
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void midi_container::scan_for_loops( bool p_xmi_loops, bool p_marker_loops, bool p_rpgmaker_loops, bool p_touhou_loops )
{
    std::vector<uint8_t> data;

    unsigned long subsong_count = m_form == 2 ? m_tracks.size() : 1;

    m_timestamp_loop_start.resize( subsong_count );
    m_timestamp_loop_end.resize( subsong_count );

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        m_timestamp_loop_start[ i ] = ~0UL;
        m_timestamp_loop_end[ i ] = ~0UL;
    }

    if ( p_touhou_loops && m_form == 0 )
    {
        bool loop_start_found = false;
        bool loop_end_found = false;
        bool errored = false;

        for ( unsigned long i = 0; !errored && i < m_tracks.size(); ++i )
        {
            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; !errored && j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change )
                {
                    if ( event.m_data[ 0 ] == 2 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_start[ 0 ] = event.m_timestamp;
                        loop_start_found = true;
                    }
                    if ( event.m_data[ 0 ] == 4 )
                    {
                        if ( event.m_data[ 1 ] != 0 )
                        {
                            errored = true;
                            break;
                        }
                        m_timestamp_loop_end[ 0 ] = event.m_timestamp;
                        loop_end_found = true;
                    }
                }
            }
        }

        if ( errored )
        {
            m_timestamp_loop_start[ 0 ] = ~0UL;
            m_timestamp_loop_end[ 0 ] = ~0UL;
        }
    }

    if ( p_rpgmaker_loops )
    {
        bool emidi_commands_found = false;

        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] == 110 || event.m_data[ 0 ] == 111 ) )
                {
                    if ( event.m_data[ 0 ] == 110 )
                    {
                        emidi_commands_found = true;
                        break;
                    }
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }

            if ( emidi_commands_found )
            {
                m_timestamp_loop_start[ subsong ] = ~0UL;
                m_timestamp_loop_end[ subsong ] = ~0UL;
                break;
            }
        }
    }

    if ( p_xmi_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::control_change &&
                    ( event.m_data[ 0 ] >= 0x74 && event.m_data[ 0 ] <= 0x77 ) )
                {
                    if ( event.m_data[ 0 ] == 0x74 || event.m_data[ 0 ] == 0x76 )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    if ( p_marker_loops )
    {
        for ( unsigned long i = 0; i < m_tracks.size(); ++i )
        {
            unsigned long subsong = 0;
            if ( m_form == 2 ) subsong = i;

            const midi_track & track = m_tracks[ i ];
            for ( unsigned long j = 0; j < track.get_count(); ++j )
            {
                const midi_event & event = track[ j ];
                if ( event.m_type == midi_event::extended &&
                    event.get_data_count() >= 9 &&
                    event.m_data[ 0 ] == 0xFF && event.m_data[ 1 ] == 0x06 )
                {
                    unsigned long data_count = event.get_data_count() - 2;
                    data.resize( data_count );
                    event.copy_data( &data[0], 2, data_count );

                    if ( data_count == 9 && !strncasecmp( (const char *) &data[0], "loopStart", 9 ) )
                    {
                        if ( m_timestamp_loop_start[ subsong ] == ~0UL || m_timestamp_loop_start[ subsong ] > event.m_timestamp )
                        {
                            m_timestamp_loop_start[ subsong ] = event.m_timestamp;
                        }
                    }
                    else if ( data_count == 7 && !strncasecmp( (const char *) &data[0], "loopEnd", 7 ) )
                    {
                        if ( m_timestamp_loop_end[ subsong ] == ~0UL || m_timestamp_loop_end[ subsong ] < event.m_timestamp )
                        {
                            m_timestamp_loop_end[ subsong ] = event.m_timestamp;
                        }
                    }
                }
            }
        }
    }

    // Sanity

    for ( unsigned long i = 0; i < subsong_count; ++i )
    {
        unsigned long timestamp_song_end;
        if ( m_form == 2 )
            timestamp_song_end = m_tracks[i][m_tracks[i].get_count()-1].m_timestamp;
        else
        {
            timestamp_song_end = 0;
            for (unsigned long j = 0; j < m_tracks.size(); ++j)
            {
                const midi_track & track = m_tracks[j];
                unsigned long timestamp = track[track.get_count()-1].m_timestamp;
                if (timestamp > timestamp_song_end)
                    timestamp_song_end = timestamp;
            }
        }
        if ( m_timestamp_loop_start[ i ] != ~0UL && ( ( m_timestamp_loop_start[ i ] == m_timestamp_loop_end[ i ] ) || ( m_timestamp_loop_start[ i ] == timestamp_song_end ) ) )
        {
            m_timestamp_loop_start[ i ] = ~0UL;
            m_timestamp_loop_end[ i ] = ~0UL;
        }
    }
}